

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.h
# Opt level: O1

void __thiscall
embree::avx512::HermiteCurveGeometryInterface<embree::HermiteCurveT>::interpolate_impl<4>
          (HermiteCurveGeometryInterface<embree::HermiteCurveT> *this,RTCInterpolateArguments *args)

{
  float fVar1;
  int *piVar4;
  float *pfVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  BufferView<char> *pBVar12;
  char *pcVar13;
  BufferView<embree::Vec3fx> *pBVar14;
  char *pcVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar2;
  float fVar3;
  
  uVar7 = args->primID;
  fVar6 = args->u;
  uVar27 = args->bufferSlot;
  pfVar9 = args->P;
  pfVar10 = args->dPdu;
  pfVar11 = args->ddPdudu;
  uVar8 = args->valueCount;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    if (uVar8 != 0) {
      pBVar12 = (this->super_CurveGeometry).vertexAttribs.items;
      pcVar13 = pBVar12[uVar27].super_RawBufferView.ptr_ofs;
      uVar26 = (ulong)(uint)pBVar12[uVar27].super_RawBufferView.stride;
      auVar33 = vpbroadcastd_avx512vl();
      fVar24 = 1.0 - fVar6;
      auVar36._4_4_ = fVar24;
      auVar36._0_4_ = fVar24;
      auVar36._8_4_ = fVar24;
      auVar36._12_4_ = fVar24;
      uVar27 = 0;
      auVar23 = vpmovsxbd_avx(ZEXT416(0x3020100));
      do {
        uVar28 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                                 *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar7);
        uVar32 = (ulong)uVar27;
        auVar34 = vpbroadcastd_avx512vl();
        auVar34 = vpor_avx(auVar34,auVar23);
        uVar31 = vpcmpgtd_avx512vl(auVar33,auVar34);
        uVar31 = uVar31 & 0xf;
        piVar4 = (int *)(pcVar13 + uVar32 * 4 + uVar26 * uVar28);
        bVar16 = (byte)uVar31;
        auVar40._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * piVar4[1];
        auVar40._0_4_ = (uint)(bVar16 & 1) * *piVar4;
        auVar40._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * piVar4[2];
        auVar40._12_4_ = (uint)(byte)(uVar31 >> 3) * piVar4[3];
        piVar4 = (int *)(pcVar13 + uVar32 * 4 + (uVar28 + 1) * uVar26);
        fVar1 = (float)((uint)(bVar16 & 1) * *piVar4);
        fVar2 = (float)((uint)((byte)(uVar31 >> 1) & 1) * piVar4[1]);
        auVar35._4_4_ = fVar2;
        auVar35._0_4_ = fVar1;
        fVar3 = (float)((uint)((byte)(uVar31 >> 2) & 1) * piVar4[2]);
        auVar35._8_4_ = fVar3;
        fVar24 = (float)((uint)(byte)(uVar31 >> 3) * piVar4[3]);
        auVar35._12_4_ = fVar24;
        if (pfVar9 != (float *)0x0) {
          auVar47._0_4_ = fVar6 * fVar1;
          auVar47._4_4_ = fVar6 * fVar2;
          auVar47._8_4_ = fVar6 * fVar3;
          auVar47._12_4_ = fVar6 * fVar24;
          auVar34 = vfmadd231ps_fma(auVar47,auVar36,auVar40);
          pfVar5 = pfVar9 + uVar32;
          bVar17 = (bool)((byte)(uVar31 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar31 >> 2) & 1);
          bVar19 = SUB81(uVar31 >> 3,0);
          *pfVar5 = (float)((uint)(bVar16 & 1) * auVar34._0_4_ |
                           (uint)!(bool)(bVar16 & 1) * (int)*pfVar5);
          pfVar5[1] = (float)((uint)bVar17 * auVar34._4_4_ | (uint)!bVar17 * (int)pfVar5[1]);
          pfVar5[2] = (float)((uint)bVar18 * auVar34._8_4_ | (uint)!bVar18 * (int)pfVar5[2]);
          pfVar5[3] = (float)((uint)bVar19 * auVar34._12_4_ | (uint)!bVar19 * (int)pfVar5[3]);
        }
        if (pfVar10 != (float *)0x0) {
          auVar34 = vsubps_avx(auVar35,auVar40);
          pfVar5 = pfVar10 + uVar32;
          bVar17 = (bool)((byte)(uVar31 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar31 >> 2) & 1);
          bVar19 = SUB81(uVar31 >> 3,0);
          *pfVar5 = (float)((uint)(bVar16 & 1) * auVar34._0_4_ |
                           (uint)!(bool)(bVar16 & 1) * (int)*pfVar5);
          pfVar5[1] = (float)((uint)bVar17 * auVar34._4_4_ | (uint)!bVar17 * (int)pfVar5[1]);
          pfVar5[2] = (float)((uint)bVar18 * auVar34._8_4_ | (uint)!bVar18 * (int)pfVar5[2]);
          pfVar5[3] = (float)((uint)bVar19 * auVar34._12_4_ | (uint)!bVar19 * (int)pfVar5[3]);
        }
        if (pfVar11 != (float *)0x0) {
          pfVar5 = pfVar11 + uVar32;
          *pfVar5 = (float)((uint)!(bool)(bVar16 & 1) * (int)*pfVar5);
          pfVar5[1] = (float)((uint)!(bool)((byte)(uVar31 >> 1) & 1) * (int)pfVar5[1]);
          pfVar5[2] = (float)((uint)!(bool)((byte)(uVar31 >> 2) & 1) * (int)pfVar5[2]);
          pfVar5[3] = (float)((uint)!SUB81(uVar31 >> 3,0) * (int)pfVar5[3]);
        }
        uVar27 = uVar27 + 4;
      } while (uVar27 < uVar8);
    }
  }
  else if (uVar8 != 0) {
    pBVar14 = (this->super_CurveGeometry).vertices.items;
    pcVar13 = pBVar14[uVar27].super_RawBufferView.ptr_ofs;
    pcVar15 = (this->super_CurveGeometry).tangents.items[uVar27].super_RawBufferView.ptr_ofs;
    uVar31 = (ulong)(uint)pBVar14[uVar27].super_RawBufferView.stride;
    auVar36 = vpbroadcastd_avx512vl();
    fVar25 = 1.0 - fVar6;
    fVar24 = fVar25 * fVar25;
    fVar3 = fVar25 * fVar24;
    fVar2 = fVar6 * 3.0 * fVar24;
    fVar1 = fVar6 * fVar6;
    fVar20 = fVar1 * 3.0;
    fVar21 = fVar25 * fVar20;
    fVar22 = fVar6 * fVar1;
    auVar34._4_4_ = fVar3;
    auVar34._0_4_ = fVar3;
    auVar34._8_4_ = fVar3;
    auVar34._12_4_ = fVar3;
    auVar42._4_4_ = fVar2;
    auVar42._0_4_ = fVar2;
    auVar42._8_4_ = fVar2;
    auVar42._12_4_ = fVar2;
    auVar43._4_4_ = fVar21;
    auVar43._0_4_ = fVar21;
    auVar43._8_4_ = fVar21;
    auVar43._12_4_ = fVar21;
    auVar44._4_4_ = fVar22;
    auVar44._0_4_ = fVar22;
    auVar44._8_4_ = fVar22;
    auVar44._12_4_ = fVar22;
    auVar50 = SUB6416(ZEXT464(0xc0000000),0);
    auVar33 = vfmsub231ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar6 * fVar25)),
                              ZEXT416(0x40000000));
    fVar3 = fVar24 * -3.0;
    auVar23 = vfmadd213ss_fma(auVar50,ZEXT416((uint)(fVar6 * fVar25)),ZEXT416((uint)fVar24));
    fVar24 = auVar23._0_4_ * 3.0;
    fVar2 = auVar33._0_4_ * 3.0;
    auVar45._4_4_ = fVar3;
    auVar45._0_4_ = fVar3;
    auVar45._8_4_ = fVar3;
    auVar45._12_4_ = fVar3;
    auVar46._4_4_ = fVar24;
    auVar46._0_4_ = fVar24;
    auVar46._8_4_ = fVar24;
    auVar46._12_4_ = fVar24;
    auVar48._4_4_ = fVar2;
    auVar48._0_4_ = fVar2;
    auVar48._8_4_ = fVar2;
    auVar48._12_4_ = fVar2;
    auVar49._4_4_ = fVar20;
    auVar49._0_4_ = fVar20;
    auVar49._8_4_ = fVar20;
    auVar49._12_4_ = fVar20;
    auVar23 = vfmadd213ss_fma(auVar50,ZEXT416((uint)fVar25),ZEXT416((uint)fVar6));
    auVar33 = vfmadd213ss_fma(auVar50,ZEXT416((uint)fVar6),ZEXT416((uint)fVar25));
    fVar25 = fVar25 * 6.0;
    fVar24 = auVar23._0_4_ * 6.0;
    fVar3 = auVar33._0_4_ * 6.0;
    fVar6 = fVar6 * 6.0;
    auVar33._4_4_ = fVar25;
    auVar33._0_4_ = fVar25;
    auVar33._8_4_ = fVar25;
    auVar33._12_4_ = fVar25;
    auVar50._4_4_ = fVar24;
    auVar50._0_4_ = fVar24;
    auVar50._8_4_ = fVar24;
    auVar50._12_4_ = fVar24;
    auVar51._4_4_ = fVar3;
    auVar51._0_4_ = fVar3;
    auVar51._8_4_ = fVar3;
    auVar51._12_4_ = fVar3;
    auVar52._4_4_ = fVar6;
    auVar52._0_4_ = fVar6;
    auVar52._8_4_ = fVar6;
    auVar52._12_4_ = fVar6;
    uVar26 = 0;
    auVar23 = vpmovsxbd_avx(ZEXT416(0x3020100));
    auVar53._8_4_ = 0xbeaaaaab;
    auVar53._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar53._12_4_ = 0xbeaaaaab;
    do {
      uVar32 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                               *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar7);
      lVar30 = uVar31 * uVar32;
      lVar29 = (uVar32 + 1) * uVar31;
      auVar37 = vpbroadcastd_avx512vl();
      auVar37 = vpor_avx(auVar37,auVar23);
      uVar32 = vpcmpgtd_avx512vl(auVar36,auVar37);
      uVar32 = uVar32 & 0xf;
      piVar4 = (int *)(pcVar13 + uVar26 * 4 + lVar30);
      bVar16 = (byte)uVar32;
      auVar37._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * piVar4[1];
      auVar37._0_4_ = (uint)(bVar16 & 1) * *piVar4;
      auVar37._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * piVar4[2];
      auVar37._12_4_ = (uint)(byte)(uVar32 >> 3) * piVar4[3];
      piVar4 = (int *)(pcVar13 + uVar26 * 4 + lVar29);
      auVar41._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * piVar4[1];
      auVar41._0_4_ = (uint)(bVar16 & 1) * *piVar4;
      auVar41._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * piVar4[2];
      auVar41._12_4_ = (uint)(byte)(uVar32 >> 3) * piVar4[3];
      piVar4 = (int *)(pcVar15 + uVar26 * 4 + lVar30);
      auVar38._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * piVar4[1];
      auVar38._0_4_ = (uint)(bVar16 & 1) * *piVar4;
      auVar38._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * piVar4[2];
      auVar38._12_4_ = (uint)(byte)(uVar32 >> 3) * piVar4[3];
      piVar4 = (int *)(pcVar15 + uVar26 * 4 + lVar29);
      auVar39._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * piVar4[1];
      auVar39._0_4_ = (uint)(bVar16 & 1) * *piVar4;
      auVar39._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * piVar4[2];
      auVar39._12_4_ = (uint)(byte)(uVar32 >> 3) * piVar4[3];
      auVar38 = vfnmadd213ps_avx512vl(auVar38,auVar53,auVar37);
      auVar39 = vfmadd213ps_avx512vl(auVar39,auVar53,auVar41);
      if (pfVar9 != (float *)0x0) {
        auVar40 = vmulps_avx512vl(auVar44,auVar41);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar43,auVar39);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar42,auVar38);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar34,auVar37);
        pfVar5 = pfVar9 + uVar26;
        bVar17 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar19 = SUB81(uVar32 >> 3,0);
        *pfVar5 = (float)((uint)(bVar16 & 1) * auVar40._0_4_ |
                         (uint)!(bool)(bVar16 & 1) * (int)*pfVar5);
        pfVar5[1] = (float)((uint)bVar17 * auVar40._4_4_ | (uint)!bVar17 * (int)pfVar5[1]);
        pfVar5[2] = (float)((uint)bVar18 * auVar40._8_4_ | (uint)!bVar18 * (int)pfVar5[2]);
        pfVar5[3] = (float)((uint)bVar19 * auVar40._12_4_ | (uint)!bVar19 * (int)pfVar5[3]);
      }
      if (pfVar10 != (float *)0x0) {
        auVar40 = vmulps_avx512vl(auVar49,auVar41);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar48,auVar39);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar46,auVar38);
        auVar40 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar37);
        pfVar5 = pfVar10 + uVar26;
        bVar17 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar19 = SUB81(uVar32 >> 3,0);
        *pfVar5 = (float)((uint)(bVar16 & 1) * auVar40._0_4_ |
                         (uint)!(bool)(bVar16 & 1) * (int)*pfVar5);
        pfVar5[1] = (float)((uint)bVar17 * auVar40._4_4_ | (uint)!bVar17 * (int)pfVar5[1]);
        pfVar5[2] = (float)((uint)bVar18 * auVar40._8_4_ | (uint)!bVar18 * (int)pfVar5[2]);
        pfVar5[3] = (float)((uint)bVar19 * auVar40._12_4_ | (uint)!bVar19 * (int)pfVar5[3]);
      }
      if (pfVar11 != (float *)0x0) {
        auVar41 = vmulps_avx512vl(auVar52,auVar41);
        auVar41 = vfmadd213ps_avx512vl(auVar39,auVar51,auVar41);
        auVar41 = vfmadd213ps_avx512vl(auVar38,auVar50,auVar41);
        auVar37 = vfmadd213ps_avx512vl(auVar37,auVar33,auVar41);
        pfVar5 = pfVar11 + uVar26;
        bVar17 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar19 = SUB81(uVar32 >> 3,0);
        *pfVar5 = (float)((uint)(bVar16 & 1) * auVar37._0_4_ |
                         (uint)!(bool)(bVar16 & 1) * (int)*pfVar5);
        pfVar5[1] = (float)((uint)bVar17 * auVar37._4_4_ | (uint)!bVar17 * (int)pfVar5[1]);
        pfVar5[2] = (float)((uint)bVar18 * auVar37._8_4_ | (uint)!bVar18 * (int)pfVar5[2]);
        pfVar5[3] = (float)((uint)bVar19 * auVar37._12_4_ | (uint)!bVar19 * (int)pfVar5[3]);
      }
      uVar27 = (int)uVar26 + 4;
      uVar26 = (ulong)uVar27;
    } while (uVar27 < uVar8);
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* we interpolate vertex attributes linearly for hermite basis */
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE)
      {
        assert(bufferSlot <= vertexAttribs.size());
        const char* vsrc = vertexAttribs[bufferSlot].getPtr();
        const size_t vstride = vertexAttribs[bufferSlot].getStride();
        
        for (unsigned int i=0; i<valueCount; i+=N)
        {
          const size_t ofs = i*sizeof(float);
          const size_t index = curves[primID];
          const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
          const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&vsrc[(index+0)*vstride+ofs]);
          const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&vsrc[(index+1)*vstride+ofs]);
          
          if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      madd(1.0f-u,p0,u*p1));
          if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   p1-p0);
          if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,vfloat<N>(zero));
        }
      }
      
      /* interpolation for vertex buffers */
      else
      {
        assert(bufferSlot < numTimeSteps);
        const char* vsrc = vertices[bufferSlot].getPtr();
        const char* tsrc = tangents[bufferSlot].getPtr();
        const size_t vstride = vertices[bufferSlot].getStride();
        const size_t tstride = vertices[bufferSlot].getStride();
        
        for (unsigned int i=0; i<valueCount; i+=N)
        {
          const size_t ofs = i*sizeof(float);
          const size_t index = curves[primID];
          const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
          const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&vsrc[(index+0)*vstride+ofs]);
          const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&vsrc[(index+1)*vstride+ofs]);
          const vfloat<N> t0 = mem<vfloat<N>>::loadu(valid,(float*)&tsrc[(index+0)*tstride+ofs]);
          const vfloat<N> t1 = mem<vfloat<N>>::loadu(valid,(float*)&tsrc[(index+1)*tstride+ofs]);
          
          const HermiteCurveT<vfloat<N>> curve(p0,t0,p1,t1);
          if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      curve.eval(u));
          if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   curve.eval_du(u));
          if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,curve.eval_dudu(u));
        }
      }
    }